

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O1

void __thiscall
slang::parsing::Preprocessor::applyDiagnosticPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  Token *this_00;
  size_type sVar1;
  int iVar2;
  SyntaxNode *pSVar3;
  SimplePragmaExpressionSyntax *pSVar4;
  Diagnostic *this_01;
  NameValuePragmaExpressionSyntax *pNVar5;
  SourceLocation SVar6;
  ParenPragmaExpressionSyntax *pPVar7;
  PragmaExpressionSyntax *expr;
  char *pcVar8;
  size_t sVar9;
  size_type __rlen_4;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *this_02;
  SourceManager *this_03;
  size_t index;
  size_type __rlen;
  ulong uVar10;
  ulong uVar11;
  size_t index_00;
  string_view sVar12;
  SourceRange SVar13;
  DiagnosticSeverity severity;
  Token last;
  undefined1 local_5c [20];
  ulong local_48;
  Token local_40;
  
  sVar1 = (pragma->args).elements.size_;
  if (sVar1 == 0) {
    local_40 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)pragma);
    SVar6 = Token::location(&local_40);
    sVar12 = Token::rawText(&local_40);
    addDiag(this,(DiagCode)0x1d0004,(SourceLocation)((long)SVar6 + sVar12._M_len * 0x10000000));
  }
  else {
    uVar11 = sVar1 + 1;
    if (1 < uVar11) {
      this_02 = &pragma->args;
      uVar11 = uVar11 >> 1;
      index_00 = 0;
      local_5c._4_8_ = this_02;
      local_5c._12_8_ = this;
      local_48 = uVar11;
      do {
        pSVar3 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                  operator[](this_02,index_00)->super_SyntaxNode;
        if (pSVar3->kind == NameValuePragmaExpression) {
          pNVar5 = slang::syntax::SyntaxNode::as<slang::syntax::NameValuePragmaExpressionSyntax>
                             (pSVar3);
          sVar12 = Token::valueText(&pNVar5->name);
          pcVar8 = sVar12._M_str;
          sVar9 = sVar12._M_len;
          if (sVar9 == 4) {
            iVar2 = bcmp(pcVar8,"warn",4);
            if (iVar2 != 0) {
LAB_0019caae:
              SVar13 = Token::range(&pNVar5->name);
              this = (Preprocessor *)local_5c._12_8_;
              addDiag((Preprocessor *)local_5c._12_8_,(DiagCode)0x1e0004,SVar13);
              this_02 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)local_5c._4_8_
              ;
              goto LAB_0019cbf4;
            }
            local_5c._0_4_ = 2;
          }
          else if (sVar9 == 5) {
            iVar2 = bcmp(pcVar8,"error",5);
            if (iVar2 == 0) {
              local_5c._0_4_ = 3;
            }
            else {
              iVar2 = bcmp(pcVar8,"fatal",5);
              if (iVar2 != 0) goto LAB_0019caae;
              local_5c._0_4_ = 4;
            }
          }
          else {
            if ((sVar9 != 6) || (iVar2 = bcmp(pcVar8,"ignore",6), iVar2 != 0)) goto LAB_0019caae;
            local_5c._0_4_ = 0;
          }
          this = (Preprocessor *)local_5c._12_8_;
          local_40.info = (Info *)local_5c;
          local_40.kind = local_5c._12_2_;
          local_40._2_1_ = local_5c[0xe];
          local_40.numFlags.raw = local_5c[0xf];
          local_40.rawLen = local_5c._16_4_;
          pSVar3 = &((pNVar5->value).ptr)->super_SyntaxNode;
          if (pSVar3 == (SyntaxNode *)0x0) {
            assert::assertFailed
                      ("ptr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                       ,0x26,
                       "T slang::not_null<slang::syntax::PragmaExpressionSyntax *>::get() const [T = slang::syntax::PragmaExpressionSyntax *]"
                      );
          }
          if (pSVar3->kind == ParenPragmaExpression) {
            pPVar7 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                               (pSVar3);
            uVar10 = (pPVar7->values).elements.size_ + 1;
            this_02 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)local_5c._4_8_;
            uVar11 = local_48;
            if (1 < uVar10) {
              index = 0;
              do {
                expr = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                       operator[](&pPVar7->values,index);
                applyDiagnosticPragma::anon_class_16_2_8b023938::operator()
                          ((anon_class_16_2_8b023938 *)&local_40,expr);
                index = index + 1;
                this_02 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)
                          local_5c._4_8_;
                uVar11 = local_48;
              } while (uVar10 >> 1 != index);
            }
          }
          else {
            applyDiagnosticPragma::anon_class_16_2_8b023938::operator()
                      ((anon_class_16_2_8b023938 *)&local_40,(PragmaExpressionSyntax *)pSVar3);
            this_02 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)local_5c._4_8_;
            uVar11 = local_48;
          }
        }
        else if (pSVar3->kind == SimplePragmaExpression) {
          pSVar4 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>
                             (pSVar3);
          this_00 = &pSVar4->value;
          sVar12 = Token::rawText(this_00);
          if ((pSVar4->value).kind == Identifier) {
            if ((sVar12._M_len == 4) &&
               (iVar2 = bcmp(sVar12._M_str,"push",4), this = (Preprocessor *)local_5c._12_8_,
               iVar2 == 0)) {
              this_03 = *(SourceManager **)local_5c._12_8_;
              SVar6 = Token::location(this_00);
              sVar9 = 8;
              pcVar8 = "__push__";
            }
            else {
              if ((sVar12._M_len != 3) ||
                 (iVar2 = bcmp(sVar12._M_str,"pop",3), this = (Preprocessor *)local_5c._12_8_,
                 iVar2 != 0)) goto LAB_0019c9d3;
              this_03 = *(SourceManager **)local_5c._12_8_;
              SVar6 = Token::location(this_00);
              sVar9 = 7;
              pcVar8 = "__pop__";
            }
            sVar12._M_str = pcVar8;
            sVar12._M_len = sVar9;
            SourceManager::addDiagnosticDirective(this_03,SVar6,sVar12,Ignored);
            this_02 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)local_5c._4_8_;
          }
          else {
LAB_0019c9d3:
            SVar13 = Token::range(this_00);
            this = (Preprocessor *)local_5c._12_8_;
            this_01 = addDiag((Preprocessor *)local_5c._12_8_,(DiagCode)0x2a0004,SVar13);
            Diagnostic::operator<<(this_01,sVar12);
            this_02 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)local_5c._4_8_;
          }
        }
        else {
          SVar13 = slang::syntax::SyntaxNode::sourceRange(pSVar3);
          addDiag(this,(DiagCode)0x1d0004,SVar13);
        }
LAB_0019cbf4:
        index_00 = index_00 + 1;
      } while (index_00 != uVar11);
    }
  }
  return;
}

Assistant:

void Preprocessor::applyDiagnosticPragma(const PragmaDirectiveSyntax& pragma) {
    if (pragma.args.empty()) {
        Token last = pragma.getLastToken();
        addDiag(diag::ExpectedDiagPragmaArg, last.location() + last.rawText().length());
        return;
    }

    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            string_view action = simple.value.rawText();
            if (simple.value.kind == TokenKind::Identifier && action == "push") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__push__",
                                                     DiagnosticSeverity::Ignored);
            }
            else if (simple.value.kind == TokenKind::Identifier && action == "pop") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__pop__",
                                                     DiagnosticSeverity::Ignored);
            }
            else {
                addDiag(diag::UnknownDiagPragmaArg, simple.value.range()) << action;
            }
        }
        else if (arg->kind == SyntaxKind::NameValuePragmaExpression) {
            auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();

            DiagnosticSeverity severity;
            string_view text = nvp.name.valueText();
            if (text == "ignore")
                severity = DiagnosticSeverity::Ignored;
            else if (text == "warn")
                severity = DiagnosticSeverity::Warning;
            else if (text == "error")
                severity = DiagnosticSeverity::Error;
            else if (text == "fatal")
                severity = DiagnosticSeverity::Fatal;
            else {
                addDiag(diag::ExpectedDiagPragmaLevel, nvp.name.range());
                continue;
            }

            auto setDirective = [&](const PragmaExpressionSyntax& expr) {
                if (expr.kind == SyntaxKind::SimplePragmaExpression) {
                    auto& simple = expr.as<SimplePragmaExpressionSyntax>();
                    if (simple.value.kind == TokenKind::StringLiteral) {
                        sourceManager.addDiagnosticDirective(simple.value.location(),
                                                             simple.value.valueText(), severity);
                    }
                    else {
                        addDiag(diag::ExpectedDiagPragmaArg, simple.value.range());
                    }
                }
                else {
                    addDiag(diag::ExpectedDiagPragmaArg, expr.sourceRange());
                }
            };

            if (nvp.value->kind == SyntaxKind::ParenPragmaExpression) {
                auto& paren = nvp.value->as<ParenPragmaExpressionSyntax>();
                for (auto value : paren.values)
                    setDirective(*value);
            }
            else {
                setDirective(*nvp.value);
            }
        }
        else {
            addDiag(diag::ExpectedDiagPragmaArg, arg->sourceRange());
        }
    }
}